

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
::int_writer<unsigned_int,fmt::v5::basic_format_specs<wchar_t>>::num_writer::operator()
          (num_writer *this,
          back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *it)

{
  wchar_t *__last;
  uint uVar1;
  uint uVar2;
  int iVar3;
  wchar_t wVar4;
  ulong uVar5;
  ulong uVar6;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> bVar7;
  long lVar8;
  wchar_t *pwVar9;
  int iVar10;
  char_type buffer [13];
  wchar_t awStack_58 [16];
  
  bVar7 = (back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>)it->container;
  uVar2 = *(uint *)this;
  uVar5 = (ulong)uVar2;
  lVar8 = (long)*(int *)(this + 4);
  __last = awStack_58 + lVar8;
  pwVar9 = __last;
  if (uVar5 < 100) {
    if (uVar2 < 10) goto LAB_00186c8f;
    uVar6 = uVar5 * 2;
    pwVar9 = awStack_58 + lVar8 + -1;
    awStack_58[lVar8 + -1] = (int)(char)internal::basic_data<void>::DIGITS[uVar5 * 2 + 1];
  }
  else {
    iVar10 = 0;
    do {
      uVar6 = uVar5;
      uVar1 = (uint)uVar6;
      uVar2 = (uint)(uVar6 / 100);
      iVar3 = (int)(uVar6 / 100);
      uVar5 = (ulong)((uVar1 + iVar3 * -100) * 2);
      pwVar9[-1] = (int)(char)internal::basic_data<void>::DIGITS[uVar5 + 1];
      if (iVar10 * -0x55555555 + 0xaaaaaaabU < 0x55555556) {
        pwVar9[-2] = *(wchar_t *)(this + 8);
        pwVar9[-3] = (int)(char)internal::basic_data<void>::DIGITS[uVar5];
        if ((uint)((iVar10 + 2) * -0x55555555) < 0x55555556) {
          lVar8 = -0x10;
          goto LAB_00186c3e;
        }
        pwVar9 = pwVar9 + -3;
      }
      else {
        pwVar9[-2] = (int)(char)internal::basic_data<void>::DIGITS[uVar5];
        if ((uint)((iVar10 + 2) * -0x55555555) < 0x55555556) {
          lVar8 = -0xc;
LAB_00186c3e:
          *(undefined4 *)((long)pwVar9 + lVar8) = *(undefined4 *)(this + 8);
          pwVar9 = (wchar_t *)((long)pwVar9 + lVar8);
        }
        else {
          pwVar9 = pwVar9 + -2;
        }
      }
      iVar10 = iVar10 + 2;
      uVar5 = uVar6 / 100;
    } while (9999 < uVar1);
    if (uVar1 < 1000) {
LAB_00186c8f:
      wVar4 = uVar2 | 0x30;
      goto LAB_00186cc3;
    }
    uVar6 = (ulong)(uint)(iVar3 + (int)(uVar6 / 100));
    pwVar9[-1] = (int)(char)internal::basic_data<void>::DIGITS[uVar6 + 1];
    if (iVar10 * -0x55555555 + 0xaaaaaaabU < 0x55555556) {
      pwVar9[-2] = *(wchar_t *)(this + 8);
      pwVar9 = pwVar9 + -2;
    }
    else {
      pwVar9 = pwVar9 + -1;
    }
  }
  wVar4 = (wchar_t)(char)internal::basic_data<void>::DIGITS[uVar6 & 0xffffffff];
LAB_00186cc3:
  pwVar9[-1] = wVar4;
  bVar7 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<wchar_t*,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>>
                    (awStack_58,__last,bVar7);
  it->container = (vector<wchar_t,_std::allocator<wchar_t>_> *)bVar7;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }